

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O3

int Aig_ManCounterExampleValueLookup(Aig_Man_t *pAig,int Id,int iFrame)

{
  int iVar1;
  uint uVar2;
  
  if (-1 < Id) {
    iVar1 = pAig->vObjs->nSize;
    if (Id < iVar1) {
      uVar2 = iVar1 * iFrame + Id;
      return (int)((*(uint *)((long)pAig->pData2 + (long)((int)uVar2 >> 5) * 4) >> (uVar2 & 0x1f) &
                   1) != 0);
    }
  }
  __assert_fail("Id >= 0 && Id < Aig_ManObjNumMax(pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigUtil.c"
                ,0x57f,"int Aig_ManCounterExampleValueLookup(Aig_Man_t *, int, int)");
}

Assistant:

int Aig_ManCounterExampleValueLookup(  Aig_Man_t * pAig, int Id, int iFrame )
{
    assert( Id >= 0 && Id < Aig_ManObjNumMax(pAig) );
    return Abc_InfoHasBit( (unsigned *)pAig->pData2, Aig_ManObjNumMax(pAig) * iFrame + Id );
}